

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::
format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
::on_text(format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
          *this,char *begin,char *end)

{
  type __n;
  iterator it_00;
  char *pcVar1;
  char *in_RDX;
  long in_RSI;
  long in_RDI;
  checked_ptr<typename_buffer<char>::value_type> *it;
  iterator out;
  type size;
  size_t in_stack_ffffffffffffffc8;
  back_insert_iterator<fmt::v6::internal::buffer<char>_> *in_stack_ffffffffffffffd0;
  undefined8 *puVar2;
  
  __n = internal::to_unsigned<long>((long)in_RDX - in_RSI);
  it_00 = basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>::
          out((basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>
               *)(in_RDI + 0x20));
  internal::reserve<fmt::v6::internal::buffer<char>,_0>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  puVar2 = (undefined8 *)&stack0xffffffffffffffc8;
  pcVar1 = std::copy_n<char_const*,unsigned_long,char*>(in_RDX,__n,(char *)it_00.container);
  *puVar2 = pcVar1;
  basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>::
  advance_to((basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>
              *)(in_RDI + 0x20),it_00);
  return;
}

Assistant:

void on_text(const Char* begin, const Char* end) {
    auto size = internal::to_unsigned(end - begin);
    auto out = context.out();
    auto&& it = internal::reserve(out, size);
    it = std::copy_n(begin, size, it);
    context.advance_to(out);
  }